

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall SQLite::Database::key(Database *this,string *aKey)

{
  Exception *this_00;
  Exception exception;
  
  if ((int)aKey->_M_string_length < 1) {
    return;
  }
  Exception::Exception
            (&exception,"No encryption support, recompile with SQLITE_HAS_CODEC to enable.");
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,&exception);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Database::key(const std::string& aKey) const
{
    int pass_len = static_cast<int>(aKey.length());
#ifdef SQLITE_HAS_CODEC
    if (pass_len > 0) {
        const int ret = sqlite3_key(mpSQLite, aKey.c_str(), pass_len);
        check(ret);
    }
#else // SQLITE_HAS_CODEC
    if (pass_len > 0) {
        const SQLite::Exception exception("No encryption support, recompile with SQLITE_HAS_CODEC to enable.");
        throw exception;
    }
#endif // SQLITE_HAS_CODEC
}